

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile.c
# Opt level: O0

uint64_t swap8(uint64_t n,int doit)

{
  int doit_local;
  uint64_t n_local;
  
  n_local = n;
  if (doit != 0) {
    n_local = n >> 0x38 | n >> 0x28 & 0xff00 | n >> 0x18 & 0xff0000 | n >> 8 & 0xff000000 |
              (n & 0xff000000) << 8 | (n & 0xff0000) << 0x18 | (n & 0xff00) << 0x28 | n << 0x38;
  }
  return n_local;
}

Assistant:

uint64_t swap8(uint64_t n, int doit)
{
    if (doit)
        return (((n >> 56) & 0x00000000000000ffULL) |
                ((n >> 40) & 0x000000000000ff00ULL) |
                ((n >> 24) & 0x0000000000ff0000ULL) |
                ((n >>  8) & 0x00000000ff000000ULL) |
                ((n <<  8) & 0x000000ff00000000ULL) |
                ((n << 24) & 0x0000ff0000000000ULL) |
                ((n << 40) & 0x00ff000000000000ULL) |
                ((n << 56) & 0xff00000000000000ULL));
    return n;
}